

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

uint32_t nh_string_to_uint(http_string_t string)

{
  bool bVar1;
  char *pcVar2;
  uint local_28;
  uint32_t local_24;
  uint32_t index;
  uint32_t result;
  http_string_t string_local;
  
  pcVar2 = string.value;
  if (pcVar2 == (char *)0x0) {
    string_local.len._4_4_ = 0;
  }
  else {
    local_24 = 0;
    local_28 = 0;
    while( true ) {
      bVar1 = false;
      if (((ulong)local_28 < string.len) && (bVar1 = false, '/' < pcVar2[local_28])) {
        bVar1 = pcVar2[local_28] < ':';
      }
      if (!bVar1) break;
      local_24 = (local_24 * 10 + (int)pcVar2[local_28]) - 0x30;
      local_28 = local_28 + 1;
    }
    string_local.len._4_4_ = local_24;
  }
  return string_local.len._4_4_;
}

Assistant:

uint32_t nh_string_to_uint(http_string_t string) {
    if (string.value == NULL) {
        return 0;
    }
    uint32_t result = 0;
    uint32_t index = 0;
    while (index < string.len && string.value[index] >= '0' && string.value[index] <= '9') {
        result = result * 10 + string.value[index] - 48;
        ++index;
    }
    return result;
}